

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::LogParser::EndElement(LogParser *this,string *name)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  reference pvVar4;
  iterator __beg;
  iterator __end;
  size_type sVar5;
  reference pvVar6;
  long lVar7;
  uint local_e0;
  allocator<char> local_d9;
  uint i_2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d0;
  string local_c8 [8];
  string added_paths_1;
  uint i_1;
  string local_90 [8];
  string added_paths;
  Change local_60;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  string *name_local;
  LogParser *this_local;
  
  paths.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = name;
  bVar1 = std::operator==(name,"logentry");
  if (bVar1) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[8])
              (this->HG,&this->Rev,&this->Changes);
  }
  else {
    bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
    if ((bVar1) ||
       (bVar1 = std::operator==(paths.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,"author"), !bVar1
       )) {
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
      if ((bVar1) ||
         (bVar1 = std::operator==(paths.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,"email"),
         !bVar1)) {
        bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
        if ((bVar1) ||
           (bVar1 = std::operator==(paths.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"date"),
           !bVar1)) {
          bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
          if ((bVar1) ||
             (bVar1 = std::operator==(paths.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"msg"),
             !bVar1)) {
            bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
            if ((bVar1) ||
               (bVar1 = std::operator==(paths.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,"files"),
               !bVar1)) {
              bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
              if ((bVar1) ||
                 (bVar1 = std::operator==(paths.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "file_adds"), !bVar1)) {
                bVar1 = std::vector<char,_std::allocator<char>_>::empty(&this->CData);
                if ((!bVar1) &&
                   (bVar1 = std::operator==(paths.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                            "file_dels"), bVar1)) {
                  local_d0._M_current =
                       (char *)std::vector<char,_std::allocator<char>_>::begin(&this->CData);
                  _i_2 = std::vector<char,_std::allocator<char>_>::end(&this->CData);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::
                  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                            (local_c8,local_d0,
                             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                             _i_2,&local_d9);
                  std::allocator<char>::~allocator(&local_d9);
                  for (local_e0 = 0;
                      sVar5 = std::
                              vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                              ::size(&this->Changes), local_e0 < sVar5; local_e0 = local_e0 + 1) {
                    pvVar6 = std::
                             vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                             ::operator[](&this->Changes,(ulong)local_e0);
                    lVar7 = std::__cxx11::string::find(local_c8,(ulong)&pvVar6->Path);
                    if (lVar7 != -1) {
                      pvVar6 = std::
                               vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                               ::operator[](&this->Changes,(ulong)local_e0);
                      pvVar6->Action = 'D';
                    }
                  }
                  std::__cxx11::string::~string(local_c8);
                }
              }
              else {
                __beg = std::vector<char,_std::allocator<char>_>::begin(&this->CData);
                __end = std::vector<char,_std::allocator<char>_>::end(&this->CData);
                std::allocator<char>::allocator();
                std::__cxx11::string::
                string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
                          (local_90,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                     )__beg._M_current,
                           (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                           __end._M_current,
                           (allocator<char> *)(added_paths_1.field_2._M_local_buf + 0xf));
                std::allocator<char>::~allocator
                          ((allocator<char> *)(added_paths_1.field_2._M_local_buf + 0xf));
                for (added_paths_1.field_2._8_4_ = 0;
                    uVar3 = (ulong)(uint)added_paths_1.field_2._8_4_,
                    sVar5 = std::
                            vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                            ::size(&this->Changes), uVar3 < sVar5;
                    added_paths_1.field_2._8_4_ = added_paths_1.field_2._8_4_ + 1) {
                  pvVar6 = std::
                           vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                           ::operator[](&this->Changes,(ulong)(uint)added_paths_1.field_2._8_4_);
                  lVar7 = std::__cxx11::string::find(local_90,(ulong)&pvVar6->Path);
                  if (lVar7 != -1) {
                    pvVar6 = std::
                             vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                             ::operator[](&this->Changes,(ulong)(uint)added_paths_1.field_2._8_4_);
                    pvVar6->Action = 'A';
                  }
                }
                std::__cxx11::string::~string(local_90);
              }
            }
            else {
              SplitCData_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_30,this);
              for (local_34 = 0; uVar3 = (ulong)local_34,
                  sVar5 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_30), uVar3 < sVar5; local_34 = local_34 + 1) {
                cmCTestGlobalVC::Change::Change(&local_60,'U');
                cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_60);
                cmCTestGlobalVC::Change::~Change(&local_60);
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_30,(ulong)local_34);
                std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)pvVar4);
                std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                push_back(&this->Changes,&this->CurChange);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_30);
            }
          }
          else {
            pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
            std::vector<char,_std::allocator<char>_>::size(&this->CData);
            std::__cxx11::string::assign((char *)&(this->Rev).Log,(ulong)pvVar2);
          }
        }
        else {
          pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
          std::vector<char,_std::allocator<char>_>::size(&this->CData);
          std::__cxx11::string::assign((char *)&(this->Rev).Date,(ulong)pvVar2);
        }
      }
      else {
        pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
        std::vector<char,_std::allocator<char>_>::size(&this->CData);
        std::__cxx11::string::assign((char *)&(this->Rev).EMail,(ulong)pvVar2);
      }
    }
    else {
      pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->CData,0);
      std::vector<char,_std::allocator<char>_>::size(&this->CData);
      std::__cxx11::string::assign((char *)&(this->Rev).Author,(ulong)pvVar2);
    }
  }
  std::vector<char,_std::allocator<char>_>::clear(&this->CData);
  return;
}

Assistant:

void EndElement(const std::string& name) CM_OVERRIDE
  {
    if (name == "logentry") {
      this->HG->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "email") {
      this->Rev.EMail.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(&this->CData[0], this->CData.size());
    } else if (!this->CData.empty() && name == "files") {
      std::vector<std::string> paths = this->SplitCData();
      for (unsigned int i = 0; i < paths.size(); ++i) {
        // Updated by default, will be modified using file_adds and
        // file_dels.
        this->CurChange = Change('U');
        this->CurChange.Path = paths[i];
        this->Changes.push_back(this->CurChange);
      }
    } else if (!this->CData.empty() && name == "file_adds") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (unsigned int i = 0; i < this->Changes.size(); ++i) {
        if (added_paths.find(this->Changes[i].Path) != std::string::npos) {
          this->Changes[i].Action = 'A';
        }
      }
    } else if (!this->CData.empty() && name == "file_dels") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (unsigned int i = 0; i < this->Changes.size(); ++i) {
        if (added_paths.find(this->Changes[i].Path) != std::string::npos) {
          this->Changes[i].Action = 'D';
        }
      }
    }
    this->CData.clear();
  }